

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_linklist_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  return 0;
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    uo_linklist head;
    uo_linklist link1;
    uo_linklist link2;
    uo_linklist link3;

    uo_linklist_selflink(&head);
    uo_linklist_reset(&link1);
    uo_linklist_reset(&link2);
    uo_linklist_reset(&link3);

    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_link(&head, &link1);
    passed &= !uo_linklist_is_empty(&head);
    passed &= head.next == &link1;
    passed &= head.prev == &link1;
    passed &= link1.next == &head;
    passed &= link1.prev == &head;

    uo_linklist_link(&head, &link2);
    passed &= head.next == &link1;
    passed &= head.prev == &link2;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &head;
    passed &= link2.prev == &link1;

    uo_linklist_link(&head, &link3);
    passed &= head.next == &link1;
    passed &= head.prev == &link3;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &link3;
    passed &= link2.prev == &link1;
    passed &= link3.next == &head;
    passed &= link3.prev == &link2;

    uo_linklist_unlink(&link3);
    passed &= head.next == &link1;
    passed &= head.prev == &link2;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &head;
    passed &= link2.prev == &link1;
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link2);
    passed &= head.next == &link1;
    passed &= head.prev == &link1;
    passed &= link1.next == &head;
    passed &= link1.prev == &head;
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link1);
    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&head);
    passed &= !uo_linklist_is_linked(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_selflink(&head);
    uo_linklist_link(&head, &link1);
    uo_linklist_link(&link1, &link2);
    uo_linklist_link(&link2, &link3);
    passed &= head.prev == &link1;
    passed &= head.next == &link3;
    passed &= link1.prev == &link2;
    passed &= link1.next == &head;
    passed &= link2.prev == &link3;
    passed &= link2.next == &link1;
    passed &= link3.prev == &head;
    passed &= link3.next == &link2;

    uo_linklist_unlink(&link3);
    passed &= head.prev == &link1;
    passed &= head.next == &link2;
    passed &= link1.prev == &link2;
    passed &= link1.next == &head;
    passed &= link2.prev == &head;
    passed &= link2.next == &link1;
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link2);
    passed &= head.prev == &link1;
    passed &= head.next == &link1;
    passed &= link1.prev == &head;
    passed &= link1.next == &head;
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link1);
    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&head);
    passed &= !uo_linklist_is_linked(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    return passed ? 0 : 1;
}